

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O1

void __thiscall
DLevelScript::DLevelScript
          (DLevelScript *this,AActor *who,line_t_conflict *where,int num,ScriptPtr *code,
          FBehavior *module,int *args,int argcount,int flags)

{
  TArray<int,_int> *this_00;
  int *piVar1;
  DACSThinker *this_01;
  long lVar2;
  Node *pNVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  FString local_40;
  AActor *local_38;
  
  local_38 = who;
  DObject::DObject(&this->super_DObject);
  (this->super_DObject)._vptr_DObject = (_func_int **)&PTR_StaticType_006fb110;
  this_00 = &this->Localvars;
  (this->Localvars).Array = (int *)0x0;
  (this->Localvars).Most = 0;
  (this->Localvars).Count = 0;
  this->activeBehavior = module;
  if (DACSThinker::ActiveThinker.field_0 != (DACSThinker *)0x0) {
    if ((*(byte *)((long)DACSThinker::ActiveThinker.field_0 + 0x20) & 0x20) == 0) goto LAB_003c1b2e;
    DACSThinker::ActiveThinker.field_0 = (anon_union_8_2_947301c2_for_TObjPtr<DACSThinker>_1)0x0;
  }
  this_01 = (DACSThinker *)
            M_Malloc_Dbg(0x60,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobject.h"
                         ,0x1f9);
  DACSThinker::DACSThinker(this_01);
LAB_003c1b2e:
  this->script = num;
  if ((ushort)code->ArgCount <= code->VarCount) {
    TArray<int,_int>::Resize(this_00,(uint)code->VarCount);
    memset(this_00->Array,0,(ulong)code->VarCount << 2);
    uVar5 = (uint)code->ArgCount;
    if (argcount < (int)(uint)code->ArgCount) {
      uVar5 = argcount;
    }
    if (0 < (int)uVar5) {
      piVar1 = this_00->Array;
      uVar6 = 0;
      do {
        piVar1[uVar6] = args[uVar6];
        uVar6 = uVar6 + 1;
      } while (uVar5 != uVar6);
    }
    this->pc = (int *)(module->Data + code->Address);
    lVar2 = ((long)code - (long)module->Scripts >> 3) * 0x6db6db6db6db6db7;
    iVar4 = -1;
    if (lVar2 < module->NumScripts) {
      iVar4 = (int)lVar2;
    }
    this->InModuleScriptNumber = iVar4;
    (this->activator).field_0.p = local_38;
    this->activationline = where;
    this->backSide = (bool)((byte)flags & 1);
    this->activefont = SmallFont;
    this->hudwidth = 0;
    this->hudheight = 0;
    this->ClipRectLeft = 0;
    this->ClipRectTop = 0;
    this->ClipRectTop = 0;
    this->ClipRectWidth = 0;
    this->ClipRectHeight = 0;
    this->WrapWidth = 0;
    this->HandleAspect = true;
    this->state = SCRIPT_Running;
    if ((flags & 2U) == 0) {
      pNVar3 = TMap<int,_DLevelScript_*,_THashTraits<int>,_TValueTraits<DLevelScript_*>_>::GetNode
                         ((TMap<int,_DLevelScript_*,_THashTraits<int>,_TValueTraits<DLevelScript_*>_>
                           *)((long)DACSThinker::ActiveThinker.field_0 + 0x38),num);
      (pNVar3->Pair).Value = this;
    }
    Link(this);
    if ((level.flags2._2_1_ & 0x80) != 0) {
      PutLast(this);
    }
    ScriptPresentation((int)&local_40);
    DPrintf(4,"%s started.\n",local_40.Chars);
    FString::~FString(&local_40);
    return;
  }
  __assert_fail("code->VarCount >= code->ArgCount",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_acs.cpp"
                ,0x25c7,
                "DLevelScript::DLevelScript(AActor *, line_t *, int, const ScriptPtr *, FBehavior *, const int *, int, int)"
               );
}

Assistant:

DLevelScript::DLevelScript (AActor *who, line_t *where, int num, const ScriptPtr *code, FBehavior *module,
	const int *args, int argcount, int flags)
	: activeBehavior (module)
{
	if (DACSThinker::ActiveThinker == NULL)
		new DACSThinker;

	script = num;
	assert(code->VarCount >= code->ArgCount);
	Localvars.Resize(code->VarCount);
	memset(&Localvars[0], 0, code->VarCount * sizeof(SDWORD));
	for (int i = 0; i < MIN<int>(argcount, code->ArgCount); ++i)
	{
		Localvars[i] = args[i];
	}
	pc = module->GetScriptAddress(code);
	InModuleScriptNumber = module->GetScriptIndex(code);
	activator = who;
	activationline = where;
	backSide = flags & ACS_BACKSIDE;
	activefont = SmallFont;
	hudwidth = hudheight = 0;
	ClipRectLeft = ClipRectTop = ClipRectWidth = ClipRectHeight = WrapWidth = 0;
	HandleAspect = true;
	state = SCRIPT_Running;

	// Hexen waited one second before executing any open scripts. I didn't realize
	// this when I wrote my ACS implementation. Now that I know, it's still best to
	// run them right away because there are several map properties that can't be
	// set in an editor. If an open script sets them, it looks dumb if a second
	// goes by while they're in their default state.

	if (!(flags & ACS_ALWAYS))
		DACSThinker::ActiveThinker->RunningScripts[num] = this;

	Link();

	if (level.flags2 & LEVEL2_HEXENHACK)
	{
		PutLast();
	}

	DPrintf(DMSG_SPAMMY, "%s started.\n", ScriptPresentation(num).GetChars());
}